

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutpolicy.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QLayoutPolicy *policy)

{
  long in_FS_OFFSET;
  quint32 data;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&local_24);
  (policy->field_0).data =
       local_24 >> 0x18 | (local_24 & 0x100) << 0x15 | local_24 << 0x10 & 0xff0000 |
       (local_24 & 0x3e00) << 0xf | local_24 << 0x10 & 0x40000000 | local_24 >> 8 & 0xff00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QLayoutPolicy &policy)
{
    quint32 data;
    stream >> data;
    policy.bits.horPolicy =  VALUE_OF_BITS(data, 0, 4);
    policy.bits.verPolicy =  VALUE_OF_BITS(data, 4, 4);
    policy.bits.hfw =        VALUE_OF_BITS(data, 8, 1);
    policy.bits.ctype =      VALUE_OF_BITS(data, 9, 5);
    policy.bits.wfh =        VALUE_OF_BITS(data, 14, 1);
    policy.bits.padding =   0;
    policy.bits.verStretch = VALUE_OF_BITS(data, 16, 8);
    policy.bits.horStretch = VALUE_OF_BITS(data, 24, 8);
    return stream;
}